

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O1

WhileStatement * __thiscall SQCompilation::SQParser::parseWhileStatement(SQParser *this)

{
  long lVar1;
  SQInteger SVar2;
  WhileStatement *pWVar3;
  long lVar4;
  Expr *pEVar5;
  Statement *pSVar6;
  Chunk *pCVar7;
  bool wrapped;
  bool local_29;
  
  if (500 < this->_depth) {
    reportDiagnostic(this,0x1d);
  }
  this->_depth = this->_depth + 1;
  lVar1 = (this->_lex)._tokencolumn;
  SVar2 = (this->_lex)._tokenline;
  Lex(this);
  Expect(this,0x28);
  pEVar5 = Expression(this,SQE_LOOP_CONDITION);
  Expect(this,0x29);
  local_29 = false;
  if ((this->_token == 0x7b) && (((this->_lex)._prevflags & 1) != 0)) {
    reportDiagnostic(this,0x69);
  }
  pSVar6 = IfLikeBlock(this,&local_29);
  if ((this->_lex)._prevtoken != 10) {
    lVar4 = this->_token;
    if (lVar4 < 0x7d) {
      if ((lVar4 == 0) || (lVar4 == 0x3b)) goto LAB_00161eaf;
    }
    else if ((lVar4 == 0x7d) || (lVar4 == 0x14c)) goto LAB_00161eaf;
    reportDiagnostic(this,0x38,"while loop body");
  }
LAB_00161eaf:
  if ((((this->_token != 0) && (this->_token != 0x7d)) &&
      ((this->_lex)._tokenline != (long)(pSVar6->super_Node)._coordinates.lineEnd)) &&
     (lVar1 < (this->_lex)._tokencolumn)) {
    reportDiagnostic(this,0x68);
  }
  pCVar7 = Arena::findChunk(this->_astArena,0x30);
  pWVar3 = (WhileStatement *)pCVar7->_ptr;
  pCVar7->_ptr = (uint8_t *)(pWVar3 + 1);
  (pWVar3->super_LoopStatement).super_Statement.super_Node._op = TO_WHILE;
  (pWVar3->super_LoopStatement).super_Statement.super_Node._coordinates.lineStart = -1;
  (pWVar3->super_LoopStatement).super_Statement.super_Node._coordinates.columnStart = -1;
  (pWVar3->super_LoopStatement).super_Statement.super_Node._coordinates.lineEnd = -1;
  (pWVar3->super_LoopStatement).super_Statement.super_Node._coordinates.columnEnd = -1;
  (pWVar3->super_LoopStatement)._body = pSVar6;
  (pWVar3->super_LoopStatement).super_Statement.super_Node.super_ArenaObj._vptr_ArenaObj =
       (_func_int **)&PTR__ArenaObj_001a45a0;
  pWVar3->_cond = pEVar5;
  (pWVar3->super_LoopStatement).super_Statement.super_Node._coordinates.lineStart = (int)SVar2;
  (pWVar3->super_LoopStatement).super_Statement.super_Node._coordinates.columnStart = (int)lVar1;
  (pWVar3->super_LoopStatement).super_Statement.super_Node._coordinates.lineEnd =
       (int)(this->_lex)._currentline;
  (pWVar3->super_LoopStatement).super_Statement.super_Node._coordinates.columnEnd =
       (int)(this->_lex)._currentcolumn;
  this->_depth = this->_depth - 1;
  return pWVar3;
}

Assistant:

WhileStatement* SQParser::parseWhileStatement()
{
    NestingChecker nc(this);

    SQInteger l = line(), c = column();

    Consume(TK_WHILE);

    Expect(_SC('('));
    Expr *cond = Expression(SQE_LOOP_CONDITION);
    Expect(_SC(')'));

    bool wrapped = false;
    checkBraceIndentationStyle();
    Statement *body = IfLikeBlock(wrapped);

    if (!IsEndOfStatement()) {
      reportDiagnostic(DiagnosticsId::DI_STMT_SAME_LINE, "while loop body");
    }

    if (_token != SQUIRREL_EOB && _token != _SC('}')) {
      if (line() != body->lineEnd() && column() > c) {
        reportDiagnostic(DiagnosticsId::DI_SUSPICIOUS_FMT);
      }
    }

    return setCoordinates(newNode<WhileStatement>(cond, body), l, c);
}